

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TestFunctionWrapper::call
          (TestFunctionWrapper *this,DebugMessageTestContext *ctx)

{
  if ((this->m_type != TYPE_DEBUG) && (this->m_type != TYPE_CORE)) {
    return;
  }
  (*(this->m_func).coreFn)(&ctx->super_NegativeTestContext);
  return;
}

Assistant:

void TestFunctionWrapper::call (DebugMessageTestContext& ctx) const
{
	if (m_type == TYPE_CORE)
		m_func.coreFn(static_cast<NegativeTestContext&>(ctx));
	else if (m_type == TYPE_DEBUG)
		m_func.debugFn(ctx);
	else
		DE_ASSERT(false);
}